

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

string_view __thiscall
bloaty::anon_unknown_0::ArFile::MemberReader::Consume(MemberReader *this,size_t n)

{
  char *pcVar1;
  char *in_RSI;
  size_type in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  string_view ret;
  char *local_30;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffff0;
  char *local_8;
  
  local_30 = in_RSI;
  if (((ulong)in_RSI & 1) != 0) {
    local_30 = in_RSI + 1;
  }
  __pos = in_RDI;
  pcVar1 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                             ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x10));
  if (local_30 <= pcVar1) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_fffffffffffffff0,__pos,(size_type)local_30);
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x10),
               (size_type)local_30);
    sVar3._M_len = (size_t)in_stack_fffffffffffffff0;
    sVar3._M_str = local_8;
    return sVar3;
  }
  Throw(local_30,(int)(in_RDI >> 0x20));
}

Assistant:

string_view Consume(size_t n) {
      n = (n % 2 == 0 ? n : n + 1);
      if (remaining_.size() < n) {
        THROW("premature end of file");
      }
      string_view ret = remaining_.substr(0, n);
      remaining_.remove_prefix(n);
      return ret;
    }